

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readMasterJournal(sqlite3_file *pJrnl,char *zMaster,u32 nMaster)

{
  uint in_EDX;
  undefined1 *in_RSI;
  uchar aMagic [8];
  u32 u;
  u32 cksum;
  i64 szJ;
  u32 len;
  int rc;
  i64 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar1;
  int in_stack_ffffffffffffffcc;
  sqlite3_file *in_stack_ffffffffffffffd0;
  uint local_24;
  int local_20;
  
  *in_RSI = 0;
  local_20 = sqlite3OsFileSize((sqlite3_file *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
  if ((((((local_20 == 0) && (0xf < (long)in_stack_ffffffffffffffd0)) &&
        (local_20 = read32bits(in_stack_ffffffffffffffd0,
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
        , local_20 == 0)) && ((local_24 < in_EDX && (local_24 != 0)))) &&
      ((local_20 = read32bits(in_stack_ffffffffffffffd0,
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
       local_20 == 0 &&
       ((local_20 = sqlite3OsRead(in_stack_ffffffffffffffd0,
                                  (void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(i64)in_stack_ffffffffffffffb8),
        local_20 == 0 &&
        (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) == -0x289c5edf06fa2a27))))))
     && (local_20 = sqlite3OsRead(in_stack_ffffffffffffffd0,
                                  (void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                   in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(i64)in_stack_ffffffffffffffb8),
        local_20 == 0)) {
    for (uVar1 = 0; uVar1 < local_24; uVar1 = uVar1 + 1) {
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc - (char)in_RSI[uVar1];
    }
    if (in_stack_ffffffffffffffcc != 0) {
      local_24 = 0;
    }
    in_RSI[local_24] = 0;
    return 0;
  }
  return local_20;
}

Assistant:

static int readMasterJournal(sqlite3_file *pJrnl, char *zMaster, u32 nMaster){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of master journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zMaster[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nMaster 
   || len==0 
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zMaster, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the master journal name */
  for(u=0; u<len; u++){
    cksum -= zMaster[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the master journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** master-journal filename.
    */
    len = 0;
  }
  zMaster[len] = '\0';
   
  return SQLITE_OK;
}